

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void RegisterNodeRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  string category_03;
  string category_04;
  string category_05;
  string category_06;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterNodeRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"control","");
      category._M_string_length = in_stack_fffffffffffffed0;
      category._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand(RegisterNodeRPCCommands::commands,category,(RpcMethodFnType)local_58)
      ;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"control","");
      category_00._M_string_length = in_stack_fffffffffffffed0;
      category_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_00.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_00.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"util","");
      category_01._M_string_length = in_stack_fffffffffffffed0;
      category_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_01.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_01.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"hidden","");
      category_02._M_string_length = in_stack_fffffffffffffed0;
      category_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_02.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_02.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 3,category_02,(RpcMethodFnType)local_b8);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"hidden","");
      category_03._M_string_length = in_stack_fffffffffffffed0;
      category_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_03.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_03.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 4,category_03,(RpcMethodFnType)local_d8);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"hidden","");
      category_04._M_string_length = in_stack_fffffffffffffed0;
      category_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_04.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_04.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 5,category_04,(RpcMethodFnType)local_f8);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"hidden","");
      category_05._M_string_length = in_stack_fffffffffffffed0;
      category_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
      category_05.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_05.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 6,category_05,(RpcMethodFnType)local_118);
      puVar3 = &stack0xfffffffffffffed8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec8,"hidden","");
      category_06._M_string_length = in_stack_fffffffffffffed0;
      category_06._M_dataplus._M_p = puVar3;
      category_06.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
      category_06.field_2._8_8_ = in_stack_fffffffffffffee0;
      CRPCCommand::CRPCCommand
                (RegisterNodeRPCCommands::commands + 7,category_06,
                 (RpcMethodFnType)&stack0xfffffffffffffec8);
      if (puVar3 != &stack0xfffffffffffffed8) {
        operator_delete(puVar3,in_stack_fffffffffffffed8 + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterNodeRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x400;
  pcmd = RegisterNodeRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterNodeRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"control", &getmemoryinfo},
        {"control", &logging},
        {"util", &getindexinfo},
        {"hidden", &setmocktime},
        {"hidden", &mockscheduler},
        {"hidden", &echo},
        {"hidden", &echojson},
        {"hidden", &echoipc},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}